

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile_next.c
# Opt level: O0

int next_writeheader(t_soundfile *sf,size_t nframes)

{
  int iVar1;
  int doit;
  ssize_t local_78;
  uint32_t local_68;
  char local_5c [4];
  uint32_t local_58;
  t_nextstep next;
  ssize_t byteswritten;
  off_t headersize;
  size_t datasize;
  int swap;
  size_t nframes_local;
  t_soundfile *sf_local;
  
  doit = soundfile_needsbyteswap(sf);
  if (nframes == 0) {
    local_68 = 0xffffffff;
  }
  else {
    local_68 = (int)nframes * sf->sf_bytesperframe;
  }
  next.ns_nchannels = 0;
  next.ns_info[0] = '\0';
  next.ns_info[1] = '\0';
  next.ns_info[2] = '\0';
  next.ns_info[3] = '\0';
  builtin_strncpy(local_5c,".snd",4);
  local_58 = swap4(0x1c,doit);
  next.ns_id = (char  [4])swap4(local_68,doit);
  next.ns_onset = 0;
  next.ns_length = swap4(sf->sf_samplerate,doit);
  next.ns_format = swap4(sf->sf_nchannels,doit);
  next.ns_samplerate = 0x206450;
  if (sf->sf_bigendian == 0) {
    swapstring4(local_5c,1);
  }
  iVar1 = sf->sf_bytespersample;
  if (iVar1 == 2) {
    next.ns_onset = swap4(3,doit);
  }
  else if (iVar1 == 3) {
    next.ns_onset = swap4(4,doit);
  }
  else {
    if (iVar1 != 4) {
      return 0;
    }
    next.ns_onset = swap4(6,doit);
  }
  local_78 = fd_write(sf->sf_fd,0,local_5c,0x1c);
  if (local_78 < 0x1c) {
    local_78 = -1;
  }
  return (int)local_78;
}

Assistant:

static int next_writeheader(t_soundfile *sf, size_t nframes)
{
    int swap = soundfile_needsbyteswap(sf);
    size_t datasize =
        (nframes > 0 ? nframes * sf->sf_bytesperframe : NEXT_UNKNOWN_SIZE);
    off_t headersize = NEXTHEADSIZE;
    ssize_t byteswritten = 0;
    t_nextstep next = {
        ".snd",                                   /* id          */
        swap4((uint32_t)headersize, swap),        /* data onset  */
        swap4((uint32_t)datasize, swap),          /* data length */
        0,                                        /* format      */
        swap4((uint32_t)sf->sf_samplerate, swap), /* sample rate */
        swap4((uint32_t)sf->sf_nchannels, swap),  /* channels    */
        "Pd "                                     /* info string */
    };

    if (!sf->sf_bigendian)
        swapstring4(next.ns_id, 1);
    switch (sf->sf_bytespersample)
    {
        case 2:
            next.ns_format = swap4(NEXT_FORMAT_LINEAR_16, swap);
            break;
        case 3:
            next.ns_format = swap4(NEXT_FORMAT_LINEAR_24, swap);
            break;
        case 4:
            next.ns_format = swap4(NEXT_FORMAT_FLOAT, swap);
            break;
        default: /* unsupported format */
            return 0;
    }

#ifdef DEBUG_SOUNDFILE
    next_posthead(&next, swap);
#endif

    byteswritten = fd_write(sf->sf_fd, 0, &next, headersize);
    return (byteswritten < headersize ? -1 : byteswritten);
}